

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O1

decks_t * play<void(*)(std::deque<unsigned_long,std::allocator<unsigned_long>>&,std::deque<unsigned_long,std::allocator<unsigned_long>>&)>
                    (decks_t *__return_storage_ptr__,decks_t *decks,size_t p1,size_t p2,
                    _func_void_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr_deque<unsigned_long,_std::allocator<unsigned_long>_>_ptr
                    *strategy)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  size_t local_38;
  size_t local_30;
  
  local_38 = p2;
  local_30 = p1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)decks,&local_30);
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)decks,&local_38);
  (*strategy)(&pmVar1->cards,&pmVar2->cards);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_deck_t>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,decks,decks);
  return __return_storage_ptr__;
}

Assistant:

auto play(decks_t decks, size_t p1, size_t p2, T strategy) {
  auto& p1d = decks.at(p1).cards;
  auto& p2d = decks.at(p2).cards;
  strategy(p1d, p2d);
  return decks;
}